

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O3

u16 __thiscall moira::Moira::getSR(Moira *this)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  unkuint9 Var9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [13];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined4 uVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  
  uVar1._0_1_ = (this->reg).sr.t1;
  uVar1._1_1_ = (this->reg).sr.t0;
  uVar1._2_1_ = (this->reg).sr.s;
  uVar1._3_1_ = (this->reg).sr.m;
  uVar1._4_1_ = (this->reg).sr.x;
  uVar1._5_1_ = (this->reg).sr.n;
  uVar1._6_1_ = (this->reg).sr.z;
  uVar1._7_1_ = (this->reg).sr.v;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = uVar1._7_1_;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = uVar1._6_1_;
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = uVar1._5_1_;
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = uVar1._4_1_;
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar7._8_7_;
  Var9 = CONCAT81(SUB158(auVar8 << 0x40,7),uVar1._3_1_);
  auVar12._9_6_ = 0;
  auVar12._0_9_ = Var9;
  auVar10._1_10_ = SUB1510(auVar12 << 0x30,5);
  auVar10[0] = uVar1._2_1_;
  auVar13._11_4_ = 0;
  auVar13._0_11_ = auVar10;
  auVar11._1_12_ = SUB1512(auVar13 << 0x20,3);
  auVar11[0] = uVar1._1_1_;
  auVar14._0_8_ =
       CONCAT26((short)Var9 * 0x1000,
                CONCAT24(auVar10._0_2_ * 0x2000,
                         CONCAT22(auVar11._0_2_ * 0x4000,(ushort)(byte)(undefined1)uVar1 * -0x8000))
               );
  auVar14._8_8_ = 0;
  uVar15 = (undefined4)(auVar14._0_8_ >> 0x20);
  auVar16._4_4_ = uVar15;
  auVar16._0_4_ = uVar15;
  auVar16._8_4_ = uVar15;
  auVar16._12_4_ = uVar15;
  return SUB162(auVar16 | auVar14,2) | SUB162(auVar16 | auVar14,0) |
         (ushort)(this->reg).sr.x << 4 |
         (ushort)(this->reg).sr.c + (ushort)(this->reg).sr.v * 2 + (ushort)(this->reg).sr.z * 4 +
         (ushort)(this->reg).sr.n * 8 | (ushort)(this->reg).sr.ipl << 8;
}

Assistant:

u16
Moira::getSR() const
{
    auto flags =
    reg.sr.t1  << 15 |
    reg.sr.t0  << 14 |
    reg.sr.s   << 13 |
    reg.sr.m   << 12 |
    reg.sr.ipl <<  8 ;

    return u16(flags | getCCR());
}